

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2sp_ref.c
# Opt level: O2

int blake2sp_init_root(blake2s_state *S,size_t outlen,size_t keylen)

{
  int iVar1;
  blake2s_param local_28;
  
  local_28.key_length = (uint8_t)keylen;
  local_28.digest_length = (uint8_t)outlen;
  local_28.fanout = '\b';
  local_28.depth = '\x02';
  local_28.leaf_length = 0;
  local_28.node_offset = 0;
  local_28.xof_length = 0;
  local_28.node_depth = '\x01';
  local_28.inner_length = ' ';
  local_28.salt[0] = '\0';
  local_28.salt[1] = '\0';
  local_28.salt[2] = '\0';
  local_28.salt[3] = '\0';
  local_28.salt[4] = '\0';
  local_28.salt[5] = '\0';
  local_28.salt[6] = '\0';
  local_28.salt[7] = '\0';
  local_28.personal[0] = '\0';
  local_28.personal[1] = '\0';
  local_28.personal[2] = '\0';
  local_28.personal[3] = '\0';
  local_28.personal[4] = '\0';
  local_28.personal[5] = '\0';
  local_28.personal[6] = '\0';
  local_28.personal[7] = '\0';
  iVar1 = blake2s_init_param(S,&local_28);
  return iVar1;
}

Assistant:

static int blake2sp_init_root( blake2s_state *S, size_t outlen, size_t keylen )
{
  blake2s_param P[1];
  P->digest_length = (uint8_t)outlen;
  P->key_length = (uint8_t)keylen;
  P->fanout = PARALLELISM_DEGREE;
  P->depth = 2;
  store32( &P->leaf_length, 0 );
  store32( &P->node_offset, 0 );
  store16( &P->xof_length, 0 );
  P->node_depth = 1;
  P->inner_length = BLAKE2S_OUTBYTES;
  memset( P->salt, 0, sizeof( P->salt ) );
  memset( P->personal, 0, sizeof( P->personal ) );
  return blake2s_init_param( S, P );
}